

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorCubes.c
# Opt level: O3

void AddToFreeCubes(Cube *p)

{
  if (p == (Cube *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorCubes.c"
                  ,0x9f,"void AddToFreeCubes(Cube *)");
  }
  if (p->Prev != (cube *)0x0) {
    __assert_fail("p->Prev == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorCubes.c"
                  ,0xa0,"void AddToFreeCubes(Cube *)");
  }
  if (p->Next != (cube *)0x0) {
    __assert_fail("p->Next == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorCubes.c"
                  ,0xa1,"void AddToFreeCubes(Cube *)");
  }
  if (p->ID != '\0') {
    p->Next = s_CubesFree;
    s_CubesFree = p;
    p->ID = '\0';
    g_CoverInfo.nCubesFree = g_CoverInfo.nCubesFree + 1;
    return;
  }
  __assert_fail("p->ID",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorCubes.c"
                ,0xa2,"void AddToFreeCubes(Cube *)");
}

Assistant:

void AddToFreeCubes( Cube * p )
{
    assert( p );
    assert( p->Prev == NULL ); // the cube should not be in use
    assert( p->Next == NULL );
    assert( p->ID );

    p->Next = s_CubesFree;
    s_CubesFree = p;

    // set the ID of the cube to 0, 
    // so that cube pair garbage collection could recognize it as different
    p->ID = 0;

    g_CoverInfo.nCubesFree++;
}